

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strip.cpp
# Opt level: O2

void __thiscall wasm::Strip::run(Strip *this,Module *module)

{
  pointer *this_00;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  __last;
  pointer puVar1;
  bool bVar2;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  _Var3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar4;
  undefined1 local_88 [8];
  CustomSection temp;
  
  _Var3._M_current =
       (module->customSections).
       super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (module->customSections).
       super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this_00 = &temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::function<bool_(wasm::CustomSection_&)>::function
            ((function<bool_(wasm::CustomSection_&)> *)this_00,&this->decider);
  _Var3 = std::
          remove_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,std::function<bool(wasm::CustomSection&)>>
                    (_Var3,__last,(function<bool_(wasm::CustomSection_&)> *)this_00);
  std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::erase
            (&module->customSections,(const_iterator)_Var3._M_current,
             (module->customSections).
             super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_88 = (undefined1  [8])&temp.name._M_string_length;
  temp.name._M_dataplus._M_p = (pointer)0x0;
  temp.name._M_string_length._0_1_ = 0;
  temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp.name.field_2._8_8_ = 0;
  temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__cxx11::string::assign(local_88);
  bVar2 = std::function<bool_(wasm::CustomSection_&)>::operator()
                    (&this->decider,(CustomSection *)local_88);
  if (bVar2) {
    Module::clearDebugInfo(module);
    puVar1 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (module->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      Function::clearNames
                ((puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      Function::clearDebugInfo
                ((puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
  }
  CustomSection::~CustomSection((CustomSection *)local_88);
  return;
}

Assistant:

void run(Module* module) override {
    // Remove name and debug sections.
    auto& sections = module->customSections;
    sections.erase(std::remove_if(sections.begin(), sections.end(), decider),
                   sections.end());
    // If we're cleaning up debug info, clear on the function and module too.
    CustomSection temp;
    temp.name = BinaryConsts::CustomSections::Name;
    if (decider(temp)) {
      module->clearDebugInfo();
      for (auto& func : module->functions) {
        func->clearNames();
        func->clearDebugInfo();
      }
    }
  }